

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O3

uint256 * BlockWitnessMerkleRoot(uint256 *__return_storage_ptr__,CBlock *block,bool *mutated)

{
  uchar *puVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  vector<uint256,_std::allocator<uint256>_> hashes;
  base_blob<256U> *pbVar6;
  pointer puVar7;
  pointer puVar8;
  pointer psVar9;
  ulong uVar10;
  long lVar11;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> leaves;
  undefined8 in_stack_ffffffffffffffa8;
  pointer puVar12;
  vector<uint256,_std::allocator<uint256>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<uint256,_std::allocator<uint256>_>::resize
            (&local_38,
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  puVar8 = local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar7 = local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar12 = local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start;
  pbVar6 = &(local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start)->super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x10] = '\0';
  (pbVar6->m_data)._M_elems[0x11] = '\0';
  (pbVar6->m_data)._M_elems[0x12] = '\0';
  (pbVar6->m_data)._M_elems[0x13] = '\0';
  (pbVar6->m_data)._M_elems[0x14] = '\0';
  (pbVar6->m_data)._M_elems[0x15] = '\0';
  (pbVar6->m_data)._M_elems[0x16] = '\0';
  (pbVar6->m_data)._M_elems[0x17] = '\0';
  pbVar6 = &(local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start)->super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x18] = '\0';
  (pbVar6->m_data)._M_elems[0x19] = '\0';
  (pbVar6->m_data)._M_elems[0x1a] = '\0';
  (pbVar6->m_data)._M_elems[0x1b] = '\0';
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  (pbVar6->m_data)._M_elems[0x1f] = '\0';
  ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar6 = &(local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start)->super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[8] = '\0';
  (pbVar6->m_data)._M_elems[9] = '\0';
  (pbVar6->m_data)._M_elems[10] = '\0';
  (pbVar6->m_data)._M_elems[0xb] = '\0';
  (pbVar6->m_data)._M_elems[0xc] = '\0';
  (pbVar6->m_data)._M_elems[0xd] = '\0';
  (pbVar6->m_data)._M_elems[0xe] = '\0';
  (pbVar6->m_data)._M_elems[0xf] = '\0';
  psVar9 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x10 < (ulong)((long)(block->vtx).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9)) {
    uVar10 = 1;
    lVar11 = 0x10;
    do {
      lVar2 = *(long *)((long)&(psVar9->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar11);
      uVar3 = *(undefined8 *)(lVar2 + 0x59);
      uVar4 = *(undefined8 *)(lVar2 + 0x61);
      uVar5 = *(undefined8 *)(lVar2 + 0x71);
      puVar1 = ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar11 * 2 + 0x10;
      *(undefined8 *)puVar1 = *(undefined8 *)(lVar2 + 0x69);
      *(undefined8 *)(puVar1 + 8) = uVar5;
      puVar1 = ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar11 * 2;
      *(undefined8 *)puVar1 = uVar3;
      *(undefined8 *)(puVar1 + 8) = uVar4;
      uVar10 = uVar10 + 1;
      psVar9 = (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x10;
    } while (uVar10 < (ulong)((long)(block->vtx).
                                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4))
    ;
  }
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar12;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffffa8;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar7;
  ComputeMerkleRoot(__return_storage_ptr__,hashes,(bool *)&stack0xffffffffffffffb0);
  if (puVar12 != (pointer)0x0) {
    operator_delete(puVar12,(long)puVar8 - (long)puVar12);
  }
  if (local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 BlockWitnessMerkleRoot(const CBlock& block, bool* mutated)
{
    std::vector<uint256> leaves;
    leaves.resize(block.vtx.size());
    leaves[0].SetNull(); // The witness hash of the coinbase is 0.
    for (size_t s = 1; s < block.vtx.size(); s++) {
        leaves[s] = block.vtx[s]->GetWitnessHash();
    }
    return ComputeMerkleRoot(std::move(leaves), mutated);
}